

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SeparationVP.cpp
# Opt level: O1

int __thiscall DIS::SeparationVP::getMarshalledSize(SeparationVP *this)

{
  int iVar1;
  
  iVar1 = EntityID::getMarshalledSize(&this->_parentEntityID);
  return iVar1 + 10;
}

Assistant:

int SeparationVP::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = marshalSize + 1;  // _recordType
   marshalSize = marshalSize + 1;  // _reasonForSeparation
   marshalSize = marshalSize + 1;  // _preEntityIndicator
   marshalSize = marshalSize + 1;  // _padding1
   marshalSize = marshalSize + _parentEntityID.getMarshalledSize();  // _parentEntityID
   marshalSize = marshalSize + 2;  // _padding2
   marshalSize = marshalSize + 4;  // _stationLocation
    return marshalSize;
}